

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O3

int cvEwtSet(N_Vector ycur,N_Vector weight,void *data)

{
  realtype rVar1;
  
  if (*(int *)((long)data + 0x24) == 2) {
    N_VAbs(ycur,*(N_Vector *)((long)data + 0xe0));
    N_VLinearSum(*(realtype *)((long)data + 0x28),*(N_Vector *)((long)data + 0xe0),1.0,
                 *(N_Vector *)((long)data + 0x38),*(N_Vector *)((long)data + 0xe0));
  }
  else {
    if (*(int *)((long)data + 0x24) != 1) {
      return 0;
    }
    N_VAbs(ycur,*(N_Vector *)((long)data + 0xe0));
    N_VScale(*(realtype *)((long)data + 0x28),*(N_Vector *)((long)data + 0xe0),
             *(N_Vector *)((long)data + 0xe0));
    N_VAddConst(*(N_Vector *)((long)data + 0xe0),*(realtype *)((long)data + 0x30),
                *(N_Vector *)((long)data + 0xe0));
  }
  if ((*(int *)((long)data + 0x40) != 0) &&
     (rVar1 = N_VMin(*(N_Vector *)((long)data + 0xe0)), rVar1 <= 0.0)) {
    return -1;
  }
  N_VInv(*(N_Vector *)((long)data + 0xe0),weight);
  return 0;
}

Assistant:

int cvEwtSet(N_Vector ycur, N_Vector weight, void *data)
{
  CVodeMem cv_mem;
  int flag = 0;

  /* data points to cv_mem here */

  cv_mem = (CVodeMem) data;

  switch(cv_mem->cv_itol) {
  case CV_SS:
    flag = cvEwtSetSS(cv_mem, ycur, weight);
    break;
  case CV_SV:
    flag = cvEwtSetSV(cv_mem, ycur, weight);
    break;
  }

  return(flag);
}